

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4faa5c::Db::parseExprPrimary(Db *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  undefined **ppuVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  int *args;
  StringView S;
  StringView Lit;
  StringView S_00;
  StringView SVar11;
  char *__end2;
  int local_38 [2];
  
  pcVar7 = this->First;
  pcVar10 = this->Last;
  if (pcVar7 == pcVar10) {
    return (Node *)0x0;
  }
  if (*pcVar7 != 'L') {
    return (Node *)0x0;
  }
  pcVar1 = pcVar7 + 1;
  this->First = pcVar1;
  if (pcVar10 == pcVar1) {
switchD_001b49c4_caseD_55:
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    SVar11 = parseNumber(this,false);
    pcVar7 = this->First;
    if (SVar11.First != SVar11.Last) {
      if (pcVar7 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar7 == 'E') {
        this->First = pcVar7 + 1;
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar5->K = KExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0022e998;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
        *(StringView *)&pNVar5[1].K = SVar11;
        return pNVar5;
      }
      return (Node *)0x0;
    }
    if (pcVar7 == this->Last) {
      return (Node *)0x0;
    }
LAB_001b4a8f:
    if (*pcVar7 == 'E') {
      this->First = pcVar7 + 1;
      return pNVar4;
    }
    return (Node *)0x0;
  }
  switch(*pcVar1) {
  case 'T':
    return (Node *)0x0;
  default:
    goto switchD_001b49c4_caseD_55;
  case '_':
    S.Last = "";
    S.First = "_Z";
    bVar2 = consumeIf(this,S);
    if (!bVar2) {
      return (Node *)0x0;
    }
    pNVar4 = parseEncoding(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pcVar7 = this->First;
    if (pcVar7 == this->Last) {
      return (Node *)0x0;
    }
    goto LAB_001b4a8f;
  case 'a':
    this->First = pcVar7 + 2;
    pcVar10 = "signed char";
    pcVar7 = "";
    break;
  case 'b':
    SVar11.Last = "";
    SVar11.First = "b0E";
    bVar2 = consumeIf(this,SVar11);
    if (bVar2) {
      args = local_38 + 1;
      local_38[1] = 0;
    }
    else {
      S_00.Last = "";
      S_00.First = "b1E";
      bVar2 = consumeIf(this,S_00);
      if (!bVar2) {
        return (Node *)0x0;
      }
      args = local_38;
      local_38[0] = 1;
    }
    pNVar4 = (Node *)(anonymous_namespace)::Db::make<(anonymous_namespace)::BoolExpr,int>
                               ((Db *)this,args);
    return pNVar4;
  case 'c':
    this->First = pcVar7 + 2;
    pcVar10 = "char";
    pcVar7 = "";
    break;
  case 'd':
    pcVar1 = pcVar7 + 2;
    this->First = pcVar1;
    if ((ulong)((long)pcVar10 - (long)pcVar1) < 0x11) {
      return (Node *)0x0;
    }
    pcVar9 = pcVar7 + 0x12;
    lVar8 = 0;
    while (lVar8 != 0x10) {
      iVar3 = isxdigit((int)pcVar1[lVar8]);
      lVar8 = lVar8 + 1;
      if (iVar3 == 0) {
        return (Node *)0x0;
      }
    }
    this->First = pcVar9;
    if (pcVar9 == pcVar10) {
      return (Node *)0x0;
    }
    if (*pcVar9 != 'E') {
      return (Node *)0x0;
    }
    this->First = pcVar7 + 0x13;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KExpr;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    ppuVar6 = &PTR_hasRHSComponentSlow_0022e8e8;
    goto LAB_001b4e0c;
  case 'e':
    this->First = pcVar7 + 2;
    if ((ulong)((long)pcVar10 - (long)(pcVar7 + 2)) < 0x15) {
      return (Node *)0x0;
    }
    pcVar9 = pcVar7 + 0x16;
    lVar8 = 2;
    while (lVar8 != 0x16) {
      iVar3 = isxdigit((int)pcVar7[lVar8]);
      lVar8 = lVar8 + 1;
      if (iVar3 == 0) {
        return (Node *)0x0;
      }
    }
    this->First = pcVar9;
    if (pcVar9 == pcVar10) {
      return (Node *)0x0;
    }
    if (*pcVar9 != 'E') {
      return (Node *)0x0;
    }
    this->First = pcVar7 + 0x17;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KExpr;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    ppuVar6 = &PTR_hasRHSComponentSlow_0022e940;
    goto LAB_001b4e0c;
  case 'f':
    pcVar1 = pcVar7 + 2;
    this->First = pcVar1;
    if ((ulong)((long)pcVar10 - (long)pcVar1) < 9) {
      return (Node *)0x0;
    }
    pcVar9 = pcVar7 + 10;
    lVar8 = 0;
    while (lVar8 != 8) {
      iVar3 = isxdigit((int)pcVar1[lVar8]);
      lVar8 = lVar8 + 1;
      if (iVar3 == 0) {
        return (Node *)0x0;
      }
    }
    this->First = pcVar9;
    if (pcVar9 == pcVar10) {
      return (Node *)0x0;
    }
    if (*pcVar9 != 'E') {
      return (Node *)0x0;
    }
    this->First = pcVar7 + 0xb;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KExpr;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    ppuVar6 = &PTR_hasRHSComponentSlow_0022e890;
LAB_001b4e0c:
    pNVar4->_vptr_Node = (_func_int **)ppuVar6;
    pNVar4[1]._vptr_Node = (_func_int **)(pcVar7 + 2);
    *(char **)&pNVar4[1].K = pcVar9;
    return pNVar4;
  case 'h':
    this->First = pcVar7 + 2;
    pcVar10 = "unsigned char";
    pcVar7 = "";
    break;
  case 'i':
    this->First = pcVar7 + 2;
    pcVar7 = "";
    pcVar10 = "";
    break;
  case 'j':
    this->First = pcVar7 + 2;
    pcVar10 = "u";
    pcVar7 = "";
    break;
  case 'l':
    this->First = pcVar7 + 2;
    pcVar10 = "l";
    pcVar7 = "";
    break;
  case 'm':
    this->First = pcVar7 + 2;
    pcVar10 = "ul";
    pcVar7 = "";
    break;
  case 'n':
    this->First = pcVar7 + 2;
    pcVar10 = "__int128";
    pcVar7 = "";
    break;
  case 'o':
    this->First = pcVar7 + 2;
    pcVar10 = "unsigned __int128";
    pcVar7 = "";
    break;
  case 's':
    this->First = pcVar7 + 2;
    pcVar10 = "short";
    pcVar7 = "";
    break;
  case 't':
    this->First = pcVar7 + 2;
    pcVar10 = "unsigned short";
    pcVar7 = "";
    break;
  case 'w':
    this->First = pcVar7 + 2;
    pcVar10 = "wchar_t";
    pcVar7 = "";
    break;
  case 'x':
    this->First = pcVar7 + 2;
    pcVar10 = "ll";
    pcVar7 = "";
    break;
  case 'y':
    this->First = pcVar7 + 2;
    pcVar10 = "ull";
    pcVar7 = "";
  }
  Lit.Last = pcVar7;
  Lit.First = pcVar10;
  pNVar4 = parseIntegerLiteral(this,Lit);
  return pNVar4;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }